

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOMaterial.cpp
# Opt level: O2

void __thiscall
Assimp::LWOImporter::FindUVChannels
          (LWOImporter *this,Surface *surf,SortedRep *sorted,Layer *layer,uint *out)

{
  UVChannel *uv;
  float fVar1;
  pointer pUVar2;
  pointer pfVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  Logger *this_00;
  ulong uVar11;
  Layer *extraout_RDX;
  Layer *extraout_RDX_00;
  Layer *extraout_RDX_01;
  Layer *extraout_RDX_02;
  Layer *extraout_RDX_03;
  Layer *extraout_RDX_04;
  ulong uVar12;
  ulong uVar13;
  LWOImporter *this_01;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  pointer pFVar17;
  vector<bool,_std::allocator<bool>_> *this_02;
  uint *puVar18;
  reference rVar19;
  uint local_dc;
  int local_cc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar14 = 0;
  uVar16 = 0;
  local_cc = 0;
  local_dc = 0;
  do {
    uVar15 = (uint)uVar16;
    pUVar2 = (layer->mUVChannels).
             super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(layer->mUVChannels).
                       super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar2) / 0x70) <= uVar16)
    {
      if (uVar14 < 8) {
        out[uVar14] = 0xffffffff;
      }
      return;
    }
    uv = pUVar2 + uVar16;
    this_02 = &pUVar2[uVar16].super_VMapEntry.abAssigned;
    for (puVar18 = (sorted->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                   .super__Vector_impl_data._M_start;
        puVar18 !=
        (sorted->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish; puVar18 = puVar18 + 1) {
      pFVar17 = (layer->mFaces).
                super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>._M_impl.
                super__Vector_impl_data._M_start + *puVar18;
      uVar13 = 0;
LAB_00423f45:
      if ((pFVar17->super_aiFace).mNumIndices <= uVar13) goto LAB_004240fd;
      uVar12 = (ulong)(pFVar17->super_aiFace).mIndices[uVar13];
      this_01 = (LWOImporter *)this_02;
      rVar19 = std::vector<bool,_std::allocator<bool>_>::operator[](this_02,uVar12);
      if ((*rVar19._M_p & (ulong)rVar19._M_mask) == 0) {
LAB_00423f92:
        uVar13 = uVar13 + 1;
        goto LAB_00423f45;
      }
      pfVar3 = (uv->super_VMapEntry).rawData.super__Vector_base<float,_std::allocator<float>_>.
               _M_impl.super__Vector_impl_data._M_start;
      fVar1 = pfVar3[uVar12 * 2];
      if ((((fVar1 == 0.0) && (!NAN(fVar1))) && (fVar1 = pfVar3[uVar12 * 2 + 1], fVar1 == 0.0)) &&
         (!NAN(fVar1))) goto LAB_00423f92;
      if (uVar14 < 8) {
        cVar4 = FindUVChannels(this_01,&surf->mColorTextures,(Layer *)rVar19._M_mask,uv,local_dc);
        cVar5 = FindUVChannels(this_01,&surf->mDiffuseTextures,extraout_RDX,uv,local_dc);
        cVar6 = FindUVChannels(this_01,&surf->mSpecularTextures,extraout_RDX_00,uv,local_dc);
        cVar7 = FindUVChannels(this_01,&surf->mGlossinessTextures,extraout_RDX_01,uv,local_dc);
        cVar8 = FindUVChannels(this_01,&surf->mOpacityTextures,extraout_RDX_02,uv,local_dc);
        cVar9 = FindUVChannels(this_01,&surf->mBumpTextures,extraout_RDX_03,uv,local_dc);
        cVar10 = FindUVChannels(this_01,&surf->mReflectionTextures,extraout_RDX_04,uv,local_dc);
        uVar13 = (ulong)uVar14;
        if (cVar10 == '\0' &&
            ((cVar9 == '\0' && cVar8 == '\0') &&
            ((cVar7 == '\0' && cVar6 == '\0') && (cVar5 == '\0' && cVar4 == '\0')))) {
          uVar14 = uVar14 + 1;
          out[uVar13] = uVar15;
          local_cc = local_cc + 1;
        }
        else {
          uVar11 = (ulong)local_dc;
          uVar12 = uVar11;
          if (local_cc != 0) {
            for (; uVar12 < uVar13; uVar12 = uVar12 + 1) {
              out[uVar12 + 1] = out[uVar12];
            }
          }
          uVar14 = uVar14 + 1;
          local_dc = local_dc + 1;
          out[uVar11] = uVar15;
        }
      }
      else {
        this_00 = DefaultLogger::get();
        std::operator+(&local_50,
                       "LWO: Maximum number of UV channels for this mesh reached. Skipping channel \'"
                       ,&pUVar2[uVar16].super_VMapEntry.name);
        std::operator+(&local_70,&local_50,"\'");
        Logger::error(this_00,local_70._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
      }
      puVar18 = (sorted->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish + -1;
LAB_004240fd:
    }
    uVar16 = (ulong)(uVar15 + 1);
  } while( true );
}

Assistant:

void LWOImporter::FindUVChannels(LWO::Surface& surf,
    LWO::SortedRep& sorted,LWO::Layer& layer,
    unsigned int out[AI_MAX_NUMBER_OF_TEXTURECOORDS])
{
    unsigned int next = 0, extra = 0, num_extra = 0;

    // Check whether we have an UV entry != 0 for one of the faces in 'sorted'
    for (unsigned int i = 0; i < layer.mUVChannels.size();++i)  {
        LWO::UVChannel& uv = layer.mUVChannels[i];

        for (LWO::SortedRep::const_iterator it = sorted.begin(); it != sorted.end(); ++it)  {

            LWO::Face& face = layer.mFaces[*it];

            for (unsigned int n = 0; n < face.mNumIndices; ++n) {
                unsigned int idx = face.mIndices[n];

                if (uv.abAssigned[idx] && ((aiVector2D*)&uv.rawData[0])[idx] != aiVector2D()) {

                    if (extra >= AI_MAX_NUMBER_OF_TEXTURECOORDS) {

                        ASSIMP_LOG_ERROR("LWO: Maximum number of UV channels for "
                            "this mesh reached. Skipping channel \'" + uv.name + "\'");

                    }
                    else {
                        // Search through all textures assigned to 'surf' and look for this UV channel
                        char had = 0;
                        had |= FindUVChannels(surf.mColorTextures,layer,uv,next);
                        had |= FindUVChannels(surf.mDiffuseTextures,layer,uv,next);
                        had |= FindUVChannels(surf.mSpecularTextures,layer,uv,next);
                        had |= FindUVChannels(surf.mGlossinessTextures,layer,uv,next);
                        had |= FindUVChannels(surf.mOpacityTextures,layer,uv,next);
                        had |= FindUVChannels(surf.mBumpTextures,layer,uv,next);
                        had |= FindUVChannels(surf.mReflectionTextures,layer,uv,next);

                        // We have a texture referencing this UV channel so we have to take special care
                        // and are willing to drop unreferenced channels in favour of it.
                        if (had != 0) {
                            if (num_extra) {

                                for (unsigned int a = next; a < std::min( extra, AI_MAX_NUMBER_OF_TEXTURECOORDS-1u ); ++a) {
                                    out[a+1] = out[a];
                                }
                            }
                            ++extra;
                            out[next++] = i;
                        }
                        // Bah ... seems not to be used at all. Push to end if enough space is available.
                        else {
                            out[extra++] = i;
                            ++num_extra;
                        }
                    }
                    it = sorted.end()-1;
                    break;
                }
            }
        }
    }
    if (extra < AI_MAX_NUMBER_OF_TEXTURECOORDS) {
        out[extra] = UINT_MAX;
    }
}